

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmisaac.cpp
# Opt level: O0

size_t isaac_get_state(isaacctx *ctx,char *buf)

{
  void *in_RSI;
  uint *in_RDI;
  int i;
  size_t sz;
  int local_24;
  void *local_18;
  
  if (in_RSI != (void *)0x0) {
    oswp4(in_RSI,(ulong)*in_RDI);
    oswp4((void *)((long)in_RSI + 4),(ulong)in_RDI[0x201]);
    oswp4((void *)((long)in_RSI + 8),(ulong)in_RDI[0x202]);
    oswp4((void *)((long)in_RSI + 0xc),(ulong)in_RDI[0x203]);
    local_18 = (void *)((long)in_RSI + 0x10);
    for (local_24 = 0; local_24 < 0x100; local_24 = local_24 + 1) {
      oswp4(local_18,(ulong)in_RDI[(long)local_24 + 1]);
      oswp4((void *)((long)local_18 + 4),(ulong)in_RDI[(long)local_24 + 0x101]);
      local_18 = (void *)((long)local_18 + 8);
    }
  }
  return 0x810;
}

Assistant:

size_t isaac_get_state(isaacctx *ctx, char *buf)
{
    /* if the didn't provide a buffer, it's a size-needed query */
    const size_t sz = 4 * (4 + ISAAC_RANDSIZ + ISAAC_RANDSIZ);
    if (buf == 0)
        return sz;

    /* copy the scalar members */
    oswp4(buf, ctx->cnt); buf += 4;
    oswp4(buf, ctx->a);   buf += 4;
    oswp4(buf, ctx->b);   buf += 4;
    oswp4(buf, ctx->c);   buf += 4;

    /* copy the array members */
    for (int i = 0 ; i < ISAAC_RANDSIZ ; ++i, buf += 8)
    {
        oswp4(buf, ctx->rsl[i]);
        oswp4(buf+4, ctx->mem[i]);
    }

    return sz;
}